

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

void mpc_input_mark(mpc_input_t *i)

{
  void *pvVar1;
  undefined8 *puVar2;
  int *in_RDI;
  
  if (0 < in_RDI[0x13]) {
    in_RDI[0x15] = in_RDI[0x15] + 1;
    if (in_RDI[0x14] < in_RDI[0x15]) {
      in_RDI[0x14] = in_RDI[0x15] + in_RDI[0x15] / 2;
      pvVar1 = realloc(*(void **)(in_RDI + 0x16),(long)in_RDI[0x14] << 5);
      *(void **)(in_RDI + 0x16) = pvVar1;
      pvVar1 = realloc(*(void **)(in_RDI + 0x18),(long)in_RDI[0x14]);
      *(void **)(in_RDI + 0x18) = pvVar1;
    }
    puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x16) + (long)(in_RDI[0x15] + -1) * 0x20);
    *puVar2 = *(undefined8 *)(in_RDI + 4);
    puVar2[1] = *(undefined8 *)(in_RDI + 6);
    puVar2[2] = *(undefined8 *)(in_RDI + 8);
    puVar2[3] = *(undefined8 *)(in_RDI + 10);
    *(char *)(*(long *)(in_RDI + 0x18) + (long)(in_RDI[0x15] + -1)) = (char)in_RDI[0x1a];
    if ((*in_RDI == 2) && (in_RDI[0x15] == 1)) {
      pvVar1 = calloc(1,1);
      *(void **)(in_RDI + 0xe) = pvVar1;
    }
  }
  return;
}

Assistant:

static void mpc_input_mark(mpc_input_t *i) {

  if (i->backtrack < 1) { return; }

  i->marks_num++;

  if (i->marks_num > i->marks_slots) {
    i->marks_slots = i->marks_num + i->marks_num / 2;
    i->marks = realloc(i->marks, sizeof(mpc_state_t) * i->marks_slots);
    i->lasts = realloc(i->lasts, sizeof(char) * i->marks_slots);
  }

  i->marks[i->marks_num-1] = i->state;
  i->lasts[i->marks_num-1] = i->last;

  if (i->type == MPC_INPUT_PIPE && i->marks_num == 1) {
    i->buffer = calloc(1, 1);
  }

}